

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O1

bool __thiscall cursespp::AppLayout::KeyPress(AppLayout *this,string *key)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  AppLayout *pAVar7;
  byte bVar8;
  AppLayout *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  IDisplayable local_38;
  undefined4 extraout_var;
  
  iVar4 = (*(((this->shortcuts).
              super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x24])();
  iVar5 = std::__cxx11::string::compare((char *)key);
  bVar8 = (byte)iVar4;
  if (((iVar5 == 0) ||
      (iVar4 = std::__cxx11::string::compare((char *)key), (bVar8 & iVar4 == 0) != 0)) ||
     (iVar4 = std::__cxx11::string::compare((char *)key), bVar8 == 1 && iVar4 == 0)) {
    if (bVar8 != 0) {
      BlurShortcuts((AppLayout *)&stack0xffffffffffffffc0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._vptr_IDisplayable ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return true;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._vptr_IDisplayable);
      return true;
    }
    FocusShortcuts(this);
  }
  else {
    if (bVar8 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)key);
      if (iVar4 == 0) {
        return true;
      }
      iVar4 = std::__cxx11::string::compare((char *)key);
      if (iVar4 == 0) {
        return true;
      }
      iVar4 = std::__cxx11::string::compare((char *)key);
      if (iVar4 == 0) {
        return true;
      }
      iVar4 = std::__cxx11::string::compare((char *)key);
      if (iVar4 == 0) {
        return true;
      }
    }
    peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar4 = (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x45])
                      (peVar1,key);
    if ((char)iVar4 == '\0') {
      (*(((this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3a])(&local_50);
      pAVar7 = local_50;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      do {
        if (pAVar7 == this || pAVar7 == (AppLayout *)0x0) {
          return pAVar7 != this && pAVar7 != (AppLayout *)0x0;
        }
        plVar6 = (long *)__dynamic_cast(pAVar7,&IWindow::typeinfo,&IKeyHandler::typeinfo,
                                        0xfffffffffffffffe);
        if ((plVar6 == (long *)0x0) ||
           (cVar3 = (**(code **)(*plVar6 + 0x10))(plVar6,key), cVar3 == '\0')) {
          iVar4 = (*(pAVar7->super_LayoutBase).super_Window.super_IWindow.super_IOrderable.
                    _vptr_IOrderable[0x25])(pAVar7);
          pAVar7 = (AppLayout *)CONCAT44(extraout_var,iVar4);
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      } while (bVar2);
    }
  }
  return true;
}

Assistant:

bool AppLayout::KeyPress(const std::string& key) {
    /* otherwise, see if the user is monkeying around with the
    shortcut bar focus... */
    const auto shortcutsFocused = this->shortcuts->IsFocused();
    if (key == "^["  ||
        (key == "KEY_ENTER" && shortcutsFocused) ||
        (key == "KEY_UP" && shortcutsFocused))
    {
        if (shortcutsFocused) {
            this->BlurShortcuts();
        }
        else {
            this->FocusShortcuts();
        }
        return true;
    }

    if (shortcutsFocused) {
        if (key == "KEY_DOWN" || key == "KEY_LEFT" ||
            key == "KEY_UP" || key == "KEY_RIGHT")
        {
            /* layouts allow focusing via TAB and sometimes arrow
            keys. suppress these from bubbling. */
            return true;
        }
    }

    /* otherwise, pass along to our child layout */
    if (this->layout->KeyPress(key)) {
        return true;
    }

    /* the child layout didn't handle it directly, so let's walk
    up the parent hierarchy to see if there's someone who can. */
    auto focus = this->layout->GetFocus().get();
    while (focus != nullptr && focus != this) {
        auto asKeyHandler = dynamic_cast<IKeyHandler*>(focus);
        if (asKeyHandler) {
            if (asKeyHandler->KeyPress(key)) {
                return true;
            }
        }
        focus = focus->GetParent();
    }

    return false;
}